

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

string * __thiscall
Compiler::extractFileName_abi_cxx11_(string *__return_storage_ptr__,Compiler *this)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (this->filePath)._M_dataplus._M_p;
  sVar2 = (this->filePath)._M_string_length;
  for (sVar3 = 0; (sVar2 != sVar3 && (pcVar1[sVar3] != '.')); sVar3 = sVar3 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Compiler::extractFileName() {
    std::string fileName;

    for (const auto &c : filePath) {
        if (c == '.') break;
        fileName += c;
    }

    return fileName;
}